

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Controller.hpp
# Opt level: O2

void __thiscall
ableton::link::
Controller<std::function<void_(unsigned_long)>,_std::function<void_(ableton::link::Tempo)>,_ableton::platforms::linux::Clock<1>,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>
::setTimeline(Controller<std::function<void_(unsigned_long)>,_std::function<void_(ableton::link::Tempo)>,_ableton::platforms::linux::Clock<1>,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>
              *this,Timeline *newTimeline,microseconds atTime)

{
  undefined4 uVar1;
  undefined4 uVar2;
  double dVar3;
  anon_class_40_3_27407e53_for_handler_ local_48;
  
  uVar1 = 0;
  uVar2 = 0x40340000;
  dVar3 = (newTimeline->tempo).super_tuple<double>.super__Tuple_impl<0UL,_double>.
          super__Head_base<0UL,_double,_false>._M_head_impl;
  if (20.0 <= dVar3) {
    uVar1 = SUB84(dVar3,0);
    uVar2 = (undefined4)((ulong)dVar3 >> 0x20);
  }
  dVar3 = 999.0;
  if ((double)CONCAT44(uVar2,uVar1) <= 999.0) {
    dVar3 = (double)CONCAT44(uVar2,uVar1);
  }
  (newTimeline->tempo).super_tuple<double>.super__Tuple_impl<0UL,_double>.
  super__Head_base<0UL,_double,_false>._M_head_impl = dVar3;
  std::mutex::lock(&this->mClientTimelineGuard);
  (this->mClientTimeline).tempo.super_tuple<double>.super__Tuple_impl<0UL,_double>.
  super__Head_base<0UL,_double,_false>._M_head_impl =
       (newTimeline->tempo).super_tuple<double>.super__Tuple_impl<0UL,_double>.
       super__Head_base<0UL,_double,_false>._M_head_impl;
  (this->mClientTimeline).beatOrigin.super_tuple<long>.super__Tuple_impl<0UL,_long>.
  super__Head_base<0UL,_long,_false>._M_head_impl =
       (newTimeline->beatOrigin).super_tuple<long>.super__Tuple_impl<0UL,_long>.
       super__Head_base<0UL,_long,_false>._M_head_impl;
  (this->mClientTimeline).timeOrigin.__r = (newTimeline->timeOrigin).__r;
  pthread_mutex_unlock((pthread_mutex_t *)&this->mClientTimelineGuard);
  local_48.newTimeline.tempo.super_tuple<double>.super__Tuple_impl<0UL,_double>.
  super__Head_base<0UL,_double,_false>._M_head_impl =
       (tuple<double>)
       (newTimeline->tempo).super_tuple<double>.super__Tuple_impl<0UL,_double>.
       super__Head_base<0UL,_double,_false>._M_head_impl;
  local_48.newTimeline.beatOrigin.super_tuple<long>.super__Tuple_impl<0UL,_long>.
  super__Head_base<0UL,_long,_false>._M_head_impl =
       (tuple<long>)
       (newTimeline->beatOrigin).super_tuple<long>.super__Tuple_impl<0UL,_long>.
       super__Head_base<0UL,_long,_false>._M_head_impl;
  local_48.newTimeline.timeOrigin.__r = (newTimeline->timeOrigin).__r;
  local_48.this = this;
  local_48.atTime.__r = atTime.__r;
  ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,ableton::util::NullLog>
  ::
  async<ableton::link::Controller<std::function<void(unsigned_long)>,std::function<void(ableton::link::Tempo)>,ableton::platforms::linux::Clock<1>,ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,ableton::util::NullLog>>::setTimeline(ableton::link::Timeline,std::chrono::duration<long,std::ratio<1l,1000000l>>)::_lambda()_1_>
            ((Context<ableton::platforms::posix::ScanIpIfAddrs,ableton::util::NullLog> *)&this->mIo,
             &local_48);
  return;
}

Assistant:

void setTimeline(Timeline newTimeline, const std::chrono::microseconds atTime)
  {
    newTimeline = clampTempo(newTimeline);
    {
      std::lock_guard<std::mutex> lock(mClientTimelineGuard);
      mClientTimeline = newTimeline;
    }
    mIo->async([this, newTimeline, atTime] {
      handleTimelineFromClient(updateSessionTimelineFromClient(
        mSessionTimeline, newTimeline, atTime, mGhostXForm));
    });
  }